

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O2

int lws_h2_settings(lws *wsi,http2_settings *settings,uchar *buf,int len)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  lws *wsi_00;
  ushort uVar4;
  int iVar5;
  int iVar6;
  lws *wsi_01;
  lws **pplVar7;
  char *reason;
  uint uVar8;
  uint32_t uVar9;
  lws **pplVar10;
  uint uVar11;
  
  wsi_01 = lws_get_network_wsi(wsi);
  if (len == 0) {
    uVar8 = 0;
  }
  else {
    uVar8 = 1;
    if (5 < len) {
      pplVar7 = &(wsi_01->mux).child_list;
      for (; 5 < len; len = len + -6) {
        uVar4 = *(ushort *)buf << 8 | *(ushort *)buf >> 8;
        if (0xfffffff7 < uVar4 - 9) {
          bVar1 = (byte)*(ushort *)((long)buf + 2);
          uVar11 = (uint)*(byte *)((long)buf + 5) | (uint)*(byte *)((long)buf + 3) << 0x10 |
                   (uint)(byte)*(ushort *)((long)buf + 4) << 8 | (uint)bVar1 << 0x18;
          uVar8 = (uint)uVar4;
          uVar9 = uVar11;
          if (uVar4 == 5) {
            if (uVar11 < (((wsi->a).vhost)->h2).set.s[5]) {
              reason = "Frame size < initial";
            }
            else {
              if (bVar1 == 0) goto LAB_00121b80;
              reason = "Settings Frame size above max";
            }
LAB_00121bde:
            uVar9 = 1;
LAB_00121be9:
            lws_h2_goaway(wsi_01,uVar9,reason);
            return 1;
          }
          if (uVar4 == 4) {
            if ((int)((uint)bVar1 << 0x18) < 0) {
              reason = "Inital Window beyond max";
              uVar9 = 3;
              goto LAB_00121be9;
            }
            pplVar10 = pplVar7;
            if (((wsi->flags & 0x40) == 0) || (uVar9 = 0x7ffffff, uVar11 != 0x7fffffff)) {
              while (wsi_00 = *pplVar10, uVar9 = uVar11, wsi_00 != (lws *)0x0) {
                uVar2 = (wsi_00->txc).tx_cr;
                _lws_log(8,"%s: adi child tc cr %d +%d -> %d","lws_h2_settings",(ulong)uVar2,
                         (ulong)(uVar11 - settings->s[4]),(ulong)((uVar2 + uVar11) - settings->s[4])
                        );
                iVar5 = uVar11 - settings->s[4];
                iVar3 = (wsi_00->txc).tx_cr;
                iVar6 = iVar5 + (wsi_00->txc).tx_cr;
                (wsi_00->txc).tx_cr = iVar6;
                if ((iVar6 != 0 && SCARRY4(iVar5,iVar3) == iVar6 < 0) &&
                   (iVar6 <= (int)(uVar11 - settings->s[4]))) {
                  lws_callback_on_writable(wsi_00);
                }
                pplVar10 = &(wsi_00->mux).sibling_list;
              }
            }
          }
          else if ((uVar8 == 2) && (1 < uVar11)) {
            reason = "ENABLE_PUSH invalid arg";
            goto LAB_00121bde;
          }
LAB_00121b80:
          settings->s[uVar8] = uVar9;
          _lws_log(8,"http2 settings %d <- 0x%x\n",(ulong)uVar8);
        }
        buf = (uchar *)((long)buf + 6);
      }
      uVar8 = (uint)(len != 0);
    }
  }
  return uVar8;
}

Assistant:

int
lws_h2_settings(struct lws *wsi, struct http2_settings *settings,
		unsigned char *buf, int len)
{
	struct lws *nwsi = lws_get_network_wsi(wsi);
	unsigned int a, b;

	if (!len)
		return 0;

	if (len < LWS_H2_SETTINGS_LEN)
		return 1;

	while (len >= LWS_H2_SETTINGS_LEN) {
		a = (unsigned int)((buf[0] << 8) | buf[1]);
		if (!a || a >= H2SET_COUNT)
			goto skip;
		b = (unsigned int)(buf[2] << 24 | buf[3] << 16 | buf[4] << 8 | buf[5]);

		switch (a) {
		case H2SET_HEADER_TABLE_SIZE:
			break;
		case H2SET_ENABLE_PUSH:
			if (b > 1) {
				lws_h2_goaway(nwsi, H2_ERR_PROTOCOL_ERROR,
					      "ENABLE_PUSH invalid arg");
				return 1;
			}
			break;
		case H2SET_MAX_CONCURRENT_STREAMS:
			break;
		case H2SET_INITIAL_WINDOW_SIZE:
			if (b > 0x7fffffff) {
				lws_h2_goaway(nwsi, H2_ERR_FLOW_CONTROL_ERROR,
					      "Inital Window beyond max");
				return 1;
			}

#if defined(LWS_WITH_CLIENT)
#if defined(LWS_AMAZON_RTOS) || defined(LWS_AMAZON_LINUX)
			if (
#else
			if (wsi->flags & LCCSCF_H2_QUIRK_OVERFLOWS_TXCR &&
#endif
			    b == 0x7fffffff) {
				b >>= 4;

				break;
			}
#endif

			/*
			 * In addition to changing the flow-control window for
			 * streams that are not yet active, a SETTINGS frame
			 * can alter the initial flow-control window size for
			 * streams with active flow-control windows (that is,
			 * streams in the "open" or "half-closed (remote)"
			 * state).  When the value of
			 * SETTINGS_INITIAL_WINDOW_SIZE changes, a receiver
			 * MUST adjust the size of all stream flow-control
			 * windows that it maintains by the difference between
			 * the new value and the old value.
			 */

			lws_start_foreach_ll(struct lws *, w,
					     nwsi->mux.child_list) {
				lwsl_info("%s: adi child tc cr %d +%d -> %d",
					  __func__, (int)w->txc.tx_cr,
					  b - (unsigned int)settings->s[a],
					  (int)(w->txc.tx_cr + (int)b -
						  (int)settings->s[a]));
				w->txc.tx_cr += (int)b - (int)settings->s[a];
				if (w->txc.tx_cr > 0 &&
				    w->txc.tx_cr <=
						  (int32_t)(b - settings->s[a]))

					lws_callback_on_writable(w);
			} lws_end_foreach_ll(w, mux.sibling_list);

			break;
		case H2SET_MAX_FRAME_SIZE:
			if (b < wsi->a.vhost->h2.set.s[H2SET_MAX_FRAME_SIZE]) {
				lws_h2_goaway(nwsi, H2_ERR_PROTOCOL_ERROR,
					      "Frame size < initial");
				return 1;
			}
			if (b > 0x00ffffff) {
				lws_h2_goaway(nwsi, H2_ERR_PROTOCOL_ERROR,
					      "Settings Frame size above max");
				return 1;
			}
			break;
		case H2SET_MAX_HEADER_LIST_SIZE:
			break;
		}
		settings->s[a] = b;
		lwsl_info("http2 settings %d <- 0x%x\n", a, b);
skip:
		len -= LWS_H2_SETTINGS_LEN;
		buf += LWS_H2_SETTINGS_LEN;
	}

	if (len)
		return 1;

	lws_h2_dump_settings(settings);

	return 0;
}